

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

Bool CheckMissingStyleSheets(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  TidyAttrId TVar2;
  TidyDocImpl *doc_00;
  Dict *pDVar3;
  int iVar4;
  Bool BVar5;
  Node **ppNVar6;
  AttVal *pAVar7;
  bool bVar8;
  
  BVar5 = no;
  ppNVar6 = &(doc->root).content;
  while ((BVar5 == no && (doc_00 = (TidyDocImpl *)*ppNVar6, doc_00 != (TidyDocImpl *)0x0))) {
    pDVar3 = (doc_00->root).tag;
    BVar5 = yes;
    if (pDVar3 == (Dict *)0x0) {
      bVar8 = false;
    }
    else {
      TVar1 = pDVar3->id;
      bVar8 = true;
      if (((TVar1 != TidyTag_FONT) && (bVar8 = true, TVar1 != TidyTag_LINK)) &&
         (bVar8 = true, TVar1 != TidyTag_STYLE)) {
        bVar8 = TVar1 == TidyTag_BASEFONT;
      }
    }
    pAVar7 = (AttVal *)&(doc_00->root).attributes;
    while ((!bVar8 && (pAVar7 = pAVar7->next, pAVar7 != (AttVal *)0x0))) {
      bVar8 = false;
      if (pAVar7->dict != (Attribute *)0x0) {
        TVar2 = pAVar7->dict->id;
        bVar8 = true;
        if (((TVar2 != TidyAttr_ALINK) && (bVar8 = true, TVar2 != TidyAttr_LINK)) &&
           ((bVar8 = true, TVar2 != TidyAttr_VLINK &&
            ((bVar8 = true, TVar2 != TidyAttr_STYLE && (bVar8 = true, TVar2 != TidyAttr_TEXT)))))) {
          if (TVar2 == TidyAttr_REL) {
            bVar8 = false;
            if (pAVar7->value != (ctmbstr)0x0) {
              node = (Node *)0x1553d4;
              iVar4 = prvTidytmbstrcasecmp(pAVar7->value,"stylesheet");
              bVar8 = iVar4 == 0;
            }
          }
          else {
            bVar8 = false;
          }
        }
      }
    }
    if (!bVar8) {
      BVar5 = CheckMissingStyleSheets(doc_00,node);
    }
    ppNVar6 = &(doc_00->root).next;
  }
  return BVar5;
}

Assistant:

static Bool CheckMissingStyleSheets( TidyDocImpl* doc, Node* node )
{
    AttVal* av;
    Node* content;
    Bool sspresent = no;

    for ( content = node->content;
          !sspresent && content != NULL;
          content = content->next )
    {
        sspresent = ( nodeIsLINK(content)  ||
                      nodeIsSTYLE(content) ||
                      nodeIsFONT(content)  ||
                      nodeIsBASEFONT(content) );

        for ( av = content->attributes;
              !sspresent && av != NULL;
              av = av->next )
        {
            sspresent = ( attrIsSTYLE(av) || attrIsTEXT(av)  ||
                          attrIsVLINK(av) || attrIsALINK(av) ||
                          attrIsLINK(av) );

            if ( !sspresent && attrIsREL(av) )
            {
                sspresent = AttrValueIs(av, "stylesheet");
            }
        }

        if ( ! sspresent )
            sspresent = CheckMissingStyleSheets( doc, content );
    }
    return sspresent;
}